

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O3

void __thiscall QtMWidgets::PageControl::mousePressEvent(PageControl *this,QMouseEvent *e)

{
  int iVar1;
  QPoint QVar2;
  double dVar3;
  double in_XMM1_Qa;
  
  iVar1 = *(int *)(e + 0x40);
  if (iVar1 == 1) {
    ((this->d).d)->leftButtonPressed = true;
    dVar3 = (double)QEventPoint::position();
    QVar2.xp = (int)((double)((ulong)dVar3 & 0x8000000000000000 | 0x3fe0000000000000) + dVar3);
    QVar2.yp = (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                    in_XMM1_Qa);
    ((this->d).d)->clickPos = QVar2;
  }
  e[0xc] = (QMouseEvent)(iVar1 == 1);
  return;
}

Assistant:

void
PageControl::mousePressEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton )
	{
		d->leftButtonPressed = true;

		d->clickPos = e->pos();

		e->accept();
	}
	else
		e->ignore();
}